

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O0

void * Mpm_ManFromIfLogic(Mpm_Man_t *pMan)

{
  Mig_Fan_t MVar1;
  char *pcVar2;
  Mig_Man_t *p;
  Vec_Int_t *pVVar3;
  Mpm_Cut_t *pMVar4;
  Gia_Man_t *pMan_00;
  int iVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  Mig_Obj_t *pMVar9;
  Gia_Obj_t *pObj_00;
  bool bVar10;
  Gia_Obj_t *local_98;
  Gia_Obj_t *pObj_1;
  int iLitNew;
  int Entry;
  int k;
  int i;
  word *pTruth;
  word uTruth;
  Vec_Int_t *vCover;
  Vec_Int_t *vLeaves2;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vPacking;
  Vec_Int_t *vMapping2;
  Vec_Int_t *vMapping;
  Mig_Obj_t *pFanin;
  Mig_Obj_t *pObj;
  Mpm_Cut_t *pCutBest;
  Gia_Man_t *pNew;
  Mpm_Man_t *pMan_local;
  
  vLeaves = (Vec_Int_t *)0x0;
  _k = &pTruth;
  pNew = (Gia_Man_t *)pMan;
  iVar5 = Mig_ManObjNum(pMan->pMig);
  vMapping2 = Vec_IntStart(iVar5);
  vPacking = Vec_IntStart(1);
  iVar5 = Mig_ManObjNum((Mig_Man_t *)pNew->pName);
  pCutBest = (Mpm_Cut_t *)Gia_ManStart(iVar5);
  uTruth = (word)Vec_IntAlloc(0x10000);
  vLeaves2 = Vec_IntAlloc(0x10);
  vCover = Vec_IntAlloc(0x10);
  Mig_ManCleanCopy((Mig_Man_t *)pNew->pName);
  pcVar2 = pNew->pName;
  pcVar2[0x50] = '\0';
  pcVar2[0x51] = '\0';
  pcVar2[0x52] = '\0';
  pcVar2[0x53] = '\0';
  while( true ) {
    iVar5 = *(int *)(pNew->pName + 0x50);
    iVar6 = Vec_PtrSize((Vec_Ptr_t *)(pNew->pName + 0x18));
    bVar10 = false;
    if (iVar5 < iVar6) {
      pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)(pNew->pName + 0x18),*(int *)(pNew->pName + 0x50));
      *(void **)(pNew->pName + 0x48) = pvVar8;
      bVar10 = pvVar8 != (void *)0x0;
    }
    if (!bVar10) break;
    pFanin = *(Mig_Obj_t **)(pNew->pName + 0x48);
    while (iVar5 = Mig_ObjIsNone(pFanin), iVar5 == 0) {
      iVar5 = Mpm_ObjMapRef((Mpm_Man_t *)pNew,pFanin);
      if ((iVar5 != 0) || (iVar5 = Mig_ObjIsTerm(pFanin), iVar5 != 0)) {
        iVar5 = Mig_ObjIsNode(pFanin);
        if (iVar5 == 0) {
          iVar5 = Mig_ObjIsCi(pFanin);
          if (iVar5 == 0) {
            iVar5 = Mig_ObjIsCo(pFanin);
            pMVar4 = pCutBest;
            if (iVar5 == 0) {
              iVar5 = Mig_ObjIsConst0(pFanin);
              pVVar3 = vMapping2;
              if (iVar5 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                              ,0x120,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
              }
              pObj_1._0_4_ = 0;
              iVar5 = Vec_IntSize(vPacking);
              Vec_IntWriteEntry(pVVar3,0,iVar5);
              Vec_IntPush(vPacking,0);
              Vec_IntPush(vPacking,0);
            }
            else {
              pMVar9 = Mig_ObjFanin0(pFanin);
              iVar5 = Mig_ObjCopy(pMVar9);
              iVar6 = Mig_ObjFaninC0(pFanin);
              iVar5 = Abc_LitNotCond(iVar5,iVar6);
              pObj_1._0_4_ = Gia_ManAppendCo((Gia_Man_t *)pMVar4,iVar5);
            }
          }
          else {
            pObj_1._0_4_ = Gia_ManAppendCi((Gia_Man_t *)pCutBest);
          }
        }
        else {
          Vec_IntClear(vLeaves2);
          pObj = (Mig_Obj_t *)Mpm_ObjCutBestP((Mpm_Man_t *)pNew,pFanin);
          iLitNew = 0;
          while( true ) {
            bVar10 = false;
            if (iLitNew < (int)((uint)pObj->pFans[1] >> 0x1b)) {
              p = (Mig_Man_t *)pNew->pName;
              iVar5 = Abc_Lit2Var((int)pObj->pFans[(long)iLitNew + 2]);
              vMapping = (Vec_Int_t *)Mig_ManObj(p,iVar5);
              bVar10 = vMapping != (Vec_Int_t *)0x0;
            }
            pMan_00 = pNew;
            pMVar9 = pObj;
            pVVar3 = vLeaves2;
            if (!bVar10) break;
            iVar5 = Mig_ObjCopy((Mig_Obj_t *)vMapping);
            Vec_IntPush(pVVar3,iVar5);
            iLitNew = iLitNew + 1;
          }
          if ((*(int *)(pNew->pSpec + 0x2c) == 0) ||
             ((*(int *)(pNew->pSpec + 0x1c) == 0 && (*(int *)(pNew->pSpec + 0x20) == 0)))) {
            pObj_1._0_4_ = Mpm_ManNodeIfToGia((Gia_Man_t *)pCutBest,(Mpm_Man_t *)pNew,pFanin,
                                              vLeaves2,0);
            pVVar3 = vMapping2;
            iVar5 = Abc_Lit2Var((int)pObj_1);
            iVar6 = Vec_IntSize(vPacking);
            Vec_IntSetEntry(pVVar3,iVar5,iVar6);
            pVVar3 = vPacking;
            iVar5 = Vec_IntSize(vLeaves2);
            Vec_IntPush(pVVar3,iVar5);
            for (iLitNew = 0; iVar5 = Vec_IntSize(vLeaves2), iLitNew < iVar5; iLitNew = iLitNew + 1)
            {
              iVar5 = Vec_IntEntry(vLeaves2,iLitNew);
              iVar5 = Abc_Lit2Var(iVar5);
              iVar6 = Abc_Lit2Var((int)pObj_1);
              if (iVar6 <= iVar5) {
                __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                              ,0x10e,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
              }
            }
            for (iLitNew = 0; iVar5 = Vec_IntSize(vLeaves2), pVVar3 = vPacking, iLitNew < iVar5;
                iLitNew = iLitNew + 1) {
              iVar5 = Vec_IntEntry(vLeaves2,iLitNew);
              pVVar3 = vPacking;
              iVar5 = Abc_Lit2Var(iVar5);
              Vec_IntPush(pVVar3,iVar5);
            }
            iVar5 = Abc_Lit2Var((int)pObj_1);
            Vec_IntPush(pVVar3,iVar5);
          }
          else {
            if (*(int *)(pNew->pSpec + 0x1c) == 0) {
              iVar5 = Abc_Lit2Var((uint)pObj->pFans[1] & 0x1ffffff);
              pTruth = (word *)Mpm_CutTruthFromDsd((Mpm_Man_t *)pMan_00,(Mpm_Cut_t *)pMVar9,iVar5);
            }
            else {
              iVar5 = Abc_Lit2Var((uint)pObj->pFans[1] & 0x1ffffff);
              _k = (word **)Mpm_CutTruth((Mpm_Man_t *)pMan_00,iVar5);
            }
            pMVar4 = pCutBest;
            iVar5 = Mig_ObjId(pFanin);
            iVar5 = Gia_ManFromIfLogicNode
                              ((void *)0x0,(Gia_Man_t *)pMVar4,iVar5,vLeaves2,vCover,(word *)_k,
                               (char *)0x0,(Vec_Int_t *)uTruth,vMapping2,vPacking,vLeaves,0,0);
            MVar1 = pObj->pFans[1];
            uVar7 = Abc_LitIsCompl((uint)pObj->pFans[1] & 0x1ffffff);
            pObj_1._0_4_ = Abc_LitNotCond(iVar5,(uint)MVar1 >> 0x19 & 1 ^ uVar7);
          }
        }
        Mig_ObjSetCopy(pFanin,(int)pObj_1);
      }
      pFanin = pFanin + 1;
    }
    *(int *)(pNew->pName + 0x50) = *(int *)(pNew->pName + 0x50) + 1;
  }
  Vec_IntFree((Vec_Int_t *)uTruth);
  Vec_IntFree(vLeaves2);
  Vec_IntFree(vCover);
  iVar5 = Vec_IntSize(vMapping2);
  iVar6 = Gia_ManObjNum((Gia_Man_t *)pCutBest);
  pVVar3 = vMapping2;
  if (iVar6 < iVar5) {
    iVar5 = Gia_ManObjNum((Gia_Man_t *)pCutBest);
    Vec_IntShrink(pVVar3,iVar5);
  }
  else {
    iVar5 = Gia_ManObjNum((Gia_Man_t *)pCutBest);
    Vec_IntFillExtra(pVVar3,iVar5,0);
  }
  iVar5 = Vec_IntSize(vMapping2);
  iVar6 = Gia_ManObjNum((Gia_Man_t *)pCutBest);
  if (iVar5 != iVar6) {
    __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                  ,0x12d,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
  }
  for (Entry = 0; iVar5 = Vec_IntSize(vMapping2), Entry < iVar5; Entry = Entry + 1) {
    iVar5 = Vec_IntEntry(vMapping2,Entry);
    pVVar3 = vMapping2;
    if (0 < iVar5) {
      iVar5 = Gia_ManObjNum((Gia_Man_t *)pCutBest);
      Vec_IntAddToEntry(pVVar3,Entry,iVar5);
    }
  }
  Vec_IntAppend(vMapping2,vPacking);
  Vec_IntFree(vPacking);
  if (*(long *)pCutBest[0x12].pLeaves == 0) {
    if (*(long *)(pCutBest + 0x16) != 0) {
      __assert_fail("pNew->vPacking == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x135,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
    *(Vec_Int_t **)pCutBest[0x12].pLeaves = vMapping2;
    *(Vec_Int_t **)(pCutBest + 0x16) = vLeaves;
    Entry = 0;
    while( true ) {
      iVar5 = Vec_IntSize(*(Vec_Int_t **)(pCutBest + 6));
      bVar10 = false;
      if (Entry < iVar5) {
        local_98 = Gia_ManCo((Gia_Man_t *)pCutBest,Entry);
        bVar10 = local_98 != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      pObj_00 = Gia_ObjFanin0(local_98);
      iVar5 = Gia_ObjIsAnd(pObj_00);
      pMVar4 = pCutBest;
      if (iVar5 != 0) {
        iVar5 = Gia_ObjFaninId0p((Gia_Man_t *)pCutBest,local_98);
        iVar5 = Gia_ObjIsLut((Gia_Man_t *)pMVar4,iVar5);
        if (iVar5 == 0) {
          __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                        ,0x13c,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
        }
      }
      Entry = Entry + 1;
    }
    return pCutBest;
  }
  __assert_fail("pNew->vMapping == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                ,0x134,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
}

Assistant:

void * Mpm_ManFromIfLogic( Mpm_Man_t * pMan )
{
    Gia_Man_t * pNew;
    Mpm_Cut_t * pCutBest;
    Mig_Obj_t * pObj, * pFanin;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover;
    word uTruth, * pTruth = &uTruth;
    int i, k, Entry, iLitNew;
//    assert( !pMan->pPars->fDeriveLuts || pMan->pPars->fTruth );
    // start mapping and packing
    vMapping  = Vec_IntStart( Mig_ManObjNum(pMan->pMig) );
    vMapping2 = Vec_IntStart( 1 );
    if ( 0 ) // pMan->pPars->fDeriveLuts && pMan->pPars->pLutStruct )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    // create new manager
    pNew = Gia_ManStart( Mig_ManObjNum(pMan->pMig) );
    // iterate through nodes used in the mapping
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    Mig_ManCleanCopy( pMan->pMig );
    Mig_ManForEachObj( pMan->pMig, pObj )
    {
        if ( !Mpm_ObjMapRef(pMan, pObj) && !Mig_ObjIsTerm(pObj) )
            continue;
        if ( Mig_ObjIsNode(pObj) )
        {
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            pCutBest = Mpm_ObjCutBestP( pMan, pObj );
            Mpm_CutForEachLeaf( pMan->pMig, pCutBest, pFanin, k )
                Vec_IntPush( vLeaves, Mig_ObjCopy(pFanin) );
            if ( pMan->pPars->fDeriveLuts && (pMan->pPars->fUseTruth || pMan->pPars->fUseDsd) )
            {
                extern int Gia_ManFromIfLogicNode( void * p, Gia_Man_t * pNew, int iObj, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, 
                    word * pRes, char * pStr, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking, int fCheck75, int fCheck44e );
                if ( pMan->pPars->fUseTruth )
                    pTruth = Mpm_CutTruth(pMan, Abc_Lit2Var(pCutBest->iFunc));
                else
                    uTruth = Mpm_CutTruthFromDsd( pMan, pCutBest, Abc_Lit2Var(pCutBest->iFunc) );
//                Kit_DsdPrintFromTruth( pTruth, Vec_IntSize(vLeaves) );  printf( "\n" );
                // perform decomposition of the cut
                iLitNew = Gia_ManFromIfLogicNode( NULL, pNew, Mig_ObjId(pObj), vLeaves, vLeaves2, pTruth, NULL, vCover, vMapping, vMapping2, vPacking, 0, 0 );
                iLitNew = Abc_LitNotCond( iLitNew, pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) );
            }
            else
            {
                // perform one of the two types of mapping: with and without structures
                iLitNew = Mpm_ManNodeIfToGia( pNew, pMan, pObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitNew), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(iLitNew) );
            }
        }
        else if ( Mig_ObjIsCi(pObj) )
            iLitNew = Gia_ManAppendCi(pNew);
        else if ( Mig_ObjIsCo(pObj) )
            iLitNew = Gia_ManAppendCo( pNew, Abc_LitNotCond(Mig_ObjCopy(Mig_ObjFanin0(pObj)), Mig_ObjFaninC0(pObj)) );
        else if ( Mig_ObjIsConst0(pObj) )
        {
            iLitNew = 0;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
        Mig_ObjSetCopy( pObj, iLitNew );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        Mig_ManObjNum(pMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / Mig_ManObjNum(pMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    return pNew;
}